

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PZMatrixMarket.cpp
# Opt level: O2

void TPZMatrixMarket::Read<std::complex<float>>
               (string *filename,TPZSBMatrix<std::complex<float>_> *fmat)

{
  istream *piVar1;
  long lVar2;
  int64_t el_1;
  long lVar3;
  int64_t el;
  long lVar4;
  int64_t col;
  int64_t row;
  int64_t nonzero;
  undefined8 local_278;
  int64_t ncol;
  int64_t nrow;
  string *local_260;
  string buf;
  ifstream input;
  
  local_260 = filename;
  std::ifstream::ifstream((istream *)&input,(string *)filename,_S_in);
  buf._M_dataplus._M_p = (pointer)&buf.field_2;
  buf._M_string_length = 0;
  buf.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&input,(string *)&buf);
  piVar1 = std::istream::_M_extract<long>((long *)&input);
  piVar1 = std::istream::_M_extract<long>((long *)piVar1);
  std::istream::_M_extract<long>((long *)piVar1);
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < 0; lVar4 = lVar4 + 1) {
    local_278 = 0;
    piVar1 = std::istream::_M_extract<long>((long *)&input);
    piVar1 = std::istream::_M_extract<long>((long *)piVar1);
    std::operator>>(piVar1,(complex *)&local_278);
    lVar2 = row - col;
    if (row - col <= lVar3) {
      lVar2 = lVar3;
    }
    lVar3 = col - row;
    if (col - row <= lVar2) {
      lVar3 = lVar2;
    }
  }
  std::__cxx11::string::~string((string *)&buf);
  std::ifstream::~ifstream(&input);
  (*(fmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xe])(fmat,nrow,ncol);
  TPZSBMatrix<std::complex<float>_>::SetBand(fmat,lVar3);
  std::ifstream::ifstream((istream *)&input,(string *)local_260,_S_in);
  buf._M_dataplus._M_p = (pointer)&buf.field_2;
  buf._M_string_length = 0;
  buf.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&input,(string *)&buf);
  piVar1 = std::istream::_M_extract<long>((long *)&input);
  piVar1 = std::istream::_M_extract<long>((long *)piVar1);
  std::istream::_M_extract<long>((long *)piVar1);
  for (lVar3 = 0; lVar3 < 0; lVar3 = lVar3 + 1) {
    local_278 = 0;
    piVar1 = std::istream::_M_extract<long>((long *)&input);
    piVar1 = std::istream::_M_extract<long>((long *)piVar1);
    std::operator>>(piVar1,(complex *)&local_278);
    row = row + -1;
    col = col + -1;
    (*(fmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x23])(fmat,row,col,(complex *)&local_278);
  }
  std::__cxx11::string::~string((string *)&buf);
  std::ifstream::~ifstream(&input);
  return;
}

Assistant:

void TPZMatrixMarket::Read(std::string filename, TPZSBMatrix<T>&fmat)
{
    int64_t nrow,ncol,nonzero=0,nsup=0,nlower=0, band=0;
    {
        std::ifstream input(filename);
        std::string buf;
        std::getline(input,buf);
        input >> nrow >> ncol >> nonzero;
        for (int64_t el=0; el<nonzero; el++) {
            int64_t row, col;
            T val;
            input >> row >> col >> val;
            if(row-col > band) band = row-col;
            if(col-row > band) band = col-row;
            row--;
            col--;
            if(row > col) nlower++;
            if(row< col ) nsup++;
        }
    }
    fmat.Redim(nrow,ncol);
    fmat.SetBand(band);
    {
        std::ifstream input(filename);
        std::string buf;
        std::getline(input,buf);
        input >> nrow >> ncol >> nonzero;
        for (int64_t el=0; el<nonzero; el++) {
            int64_t row, col;
            T val;
            input >> row >> col >> val;
            row--;
            col--;
            fmat.PutVal(row,col,val);
        }
    }
}